

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

int al_ustr_find_set(ALLEGRO_USTR *us,int start_pos,ALLEGRO_USTR *accept)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  uint32_t uc;
  int set_pos;
  int local_2c;
  
  if ((accept != (ALLEGRO_USTR *)0x0) && (0 < accept->slen)) {
    puVar5 = accept->data;
    iVar1 = accept->slen + 1;
    do {
      if ((char)*puVar5 < '\0') {
        iVar1 = 0;
        while( true ) {
          while (uVar2 = al_ustr_get(us,iVar1), uVar2 == 0xfffffffe) {
            iVar1 = iVar1 + 1;
          }
          if (uVar2 == 0xffffffff) break;
          local_2c = 0;
          while (uVar3 = al_ustr_get_next(accept,&local_2c), uVar3 != 0xffffffff) {
            if (uVar2 == uVar3) {
              return iVar1;
            }
          }
          iVar4 = 1;
          if (((0x7f < uVar2) && (iVar4 = 2, 0x7ff < uVar2)) && (iVar4 = 3, 0xffff < uVar2)) {
            iVar4 = (uint)(uVar2 < 0x110000) << 2;
          }
          iVar1 = iVar1 + iVar4;
        }
        return -1;
      }
      puVar5 = puVar5 + 1;
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  iVar1 = _al_binchr(us,start_pos,accept);
  return iVar1;
}

Assistant:

int al_ustr_find_set(const ALLEGRO_USTR *us, int start_pos,
   const ALLEGRO_USTR *accept)
{
   int rc;
   int32_t c, d;
   int pos;
   int set_pos;

   /* Fast path for ASCII characters. */
   if (all_ascii(accept)) {
      rc = _al_binchr(us, start_pos, accept);
      return (rc == _AL_BSTR_ERR) ? -1 : rc;
   }

   /* Non-ASCII. */
   pos = 0;
   while ((c = al_ustr_get(us, pos)) != -1) {
      if (c == -2) {
         /* Invalid byte sequence. */
         pos++;
         continue;
      }

      set_pos = 0;
      while ((d = al_ustr_get_next(accept, &set_pos)) != -1) {
         if (c == d)
            return pos;
      }

      pos += al_utf8_width(c);
   }

   return -1;
}